

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O3

void __thiscall
btDbvt::rayTestInternal
          (btDbvt *this,btDbvtNode *root,btVector3 *rayFrom,btVector3 *rayTo,
          btVector3 *rayDirectionInverse,uint *signs,btScalar lambda_max,btVector3 *aabbMin,
          btVector3 *aabbMax,ICollide *policy)

{
  undefined8 uVar1;
  btDbvtNode **ppbVar2;
  btDbvtNode *pbVar3;
  undefined1 auVar4 [16];
  btDbvtNode **ppbVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  int i;
  int iVar10;
  int iVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 local_58 [8];
  float afStack_50 [2];
  undefined1 local_48 [16];
  btDbvtNode **local_38;
  
  if (root != (btDbvtNode *)0x0) {
    lVar12 = (long)(this->m_rayTestStack).m_size;
    if (lVar12 < 0x80) {
      if ((this->m_rayTestStack).m_capacity < 0x80) {
        ppbVar5 = (btDbvtNode **)btAlignedAllocInternal(0x400,0x10);
        lVar6 = (long)(this->m_rayTestStack).m_size;
        if (0 < lVar6) {
          lVar8 = 0;
          do {
            ppbVar5[lVar8] = (this->m_rayTestStack).m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar6 != lVar8);
        }
        ppbVar2 = (this->m_rayTestStack).m_data;
        if ((ppbVar2 != (btDbvtNode **)0x0) && ((this->m_rayTestStack).m_ownsMemory == true)) {
          btAlignedFreeInternal(ppbVar2);
        }
        (this->m_rayTestStack).m_ownsMemory = true;
        (this->m_rayTestStack).m_data = ppbVar5;
        (this->m_rayTestStack).m_capacity = 0x80;
      }
      do {
        (this->m_rayTestStack).m_data[lVar12] = (btDbvtNode *)0x0;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x80);
    }
    (this->m_rayTestStack).m_size = 0x80;
    *(this->m_rayTestStack).m_data = root;
    iVar10 = 1;
    iVar9 = 0x7e;
    do {
      iVar11 = iVar10 + -1;
      ppbVar5 = (this->m_rayTestStack).m_data;
      pbVar3 = ppbVar5[(long)iVar10 + -1];
      uVar1 = *(undefined8 *)(pbVar3->volume).mi.m_floats;
      local_58._4_4_ =
           (float)((ulong)uVar1 >> 0x20) - (float)((ulong)*(undefined8 *)aabbMax->m_floats >> 0x20);
      local_58._0_4_ = (float)uVar1 - (float)*(undefined8 *)aabbMax->m_floats;
      unique0x10000035 = (pbVar3->volume).mi.m_floats[2] - aabbMax->m_floats[2];
      unique0x10000039 = 0;
      uVar1 = *(undefined8 *)(pbVar3->volume).mx.m_floats;
      local_48._4_4_ =
           (float)((ulong)uVar1 >> 0x20) - (float)((ulong)*(undefined8 *)aabbMin->m_floats >> 0x20);
      local_48._0_4_ = (float)uVar1 - (float)*(undefined8 *)aabbMin->m_floats;
      local_48._8_4_ = (pbVar3->volume).mx.m_floats[2] - aabbMin->m_floats[2];
      local_48._12_4_ = 0;
      fVar14 = (float)*(undefined8 *)rayFrom->m_floats;
      fVar18 = (float)((ulong)*(undefined8 *)rayFrom->m_floats >> 0x20);
      fVar13 = (float)*(undefined8 *)rayDirectionInverse->m_floats;
      fVar16 = (*(float *)(local_58 + (ulong)*signs * 0x10) - fVar14) * fVar13;
      fVar15 = (float)((ulong)*(undefined8 *)rayDirectionInverse->m_floats >> 0x20);
      fVar17 = (*(float *)(local_58 + (ulong)(1 - signs[1]) * 0x10 + 4) - fVar18) * fVar15;
      if (fVar16 <= fVar17) {
        lVar12 = (ulong)signs[1] * 0x10;
        fVar13 = fVar13 * (*(float *)(local_58 + (ulong)(1 - *signs) * 0x10) - fVar14);
        fVar15 = fVar15 * (*(float *)(local_58 + lVar12 + 4) - fVar18);
        if (fVar15 <= fVar13) {
          auVar4._4_4_ = -(uint)(fVar16 < fVar15);
          auVar4._0_4_ = -(uint)(fVar16 < fVar15);
          auVar4._8_4_ = -(uint)(fVar17 < fVar13);
          auVar4._12_4_ = -(uint)(fVar17 < fVar13);
          uVar7 = movmskpd((int)lVar12,auVar4);
          if ((uVar7 & 1) == 0) {
            fVar15 = fVar16;
          }
          if ((uVar7 & 2) == 0) {
            fVar17 = fVar13;
          }
          fVar14 = (*(float *)(local_58 + (ulong)(1 - signs[2]) * 0x10 + 8) - rayFrom->m_floats[2])
                   * rayDirectionInverse->m_floats[2];
          if ((fVar15 <= fVar14) &&
             (fVar18 = (*(float *)(local_58 + (ulong)signs[2] * 0x10 + 8) - rayFrom->m_floats[2]) *
                       rayDirectionInverse->m_floats[2], fVar18 <= fVar17)) {
            if (fVar18 <= fVar15) {
              fVar18 = fVar15;
            }
            if (fVar18 < lambda_max) {
              if (fVar17 <= fVar14) {
                fVar14 = fVar17;
              }
              if (0.0 < fVar14) {
                if ((pbVar3->field_2).childs[1] == (btDbvtNode *)0x0) {
                  (*policy->_vptr_ICollide[3])(policy,pbVar3);
                }
                else {
                  if (iVar9 < iVar11) {
                    iVar11 = (this->m_rayTestStack).m_size;
                    lVar12 = (long)iVar11;
                    iVar9 = iVar11 * 2;
                    if (iVar11 < iVar9) {
                      if ((this->m_rayTestStack).m_capacity < iVar9) {
                        if (iVar11 == 0) {
                          ppbVar5 = (btDbvtNode **)0x0;
                        }
                        else {
                          ppbVar5 = (btDbvtNode **)btAlignedAllocInternal(lVar12 << 4,0x10);
                          lVar6 = (long)(this->m_rayTestStack).m_size;
                          if (0 < lVar6) {
                            lVar8 = 0;
                            do {
                              ppbVar5[lVar8] = (this->m_rayTestStack).m_data[lVar8];
                              lVar8 = lVar8 + 1;
                            } while (lVar6 != lVar8);
                          }
                        }
                        ppbVar2 = (this->m_rayTestStack).m_data;
                        if ((ppbVar2 != (btDbvtNode **)0x0) &&
                           ((this->m_rayTestStack).m_ownsMemory == true)) {
                          local_38 = ppbVar5;
                          btAlignedFreeInternal(ppbVar2);
                          ppbVar5 = local_38;
                        }
                        (this->m_rayTestStack).m_ownsMemory = true;
                        (this->m_rayTestStack).m_data = ppbVar5;
                        (this->m_rayTestStack).m_capacity = iVar9;
                      }
                      do {
                        (this->m_rayTestStack).m_data[lVar12] = (btDbvtNode *)0x0;
                        lVar12 = lVar12 + 1;
                      } while (iVar9 != lVar12);
                      ppbVar5 = (this->m_rayTestStack).m_data;
                    }
                    (this->m_rayTestStack).m_size = iVar9;
                    iVar9 = iVar9 + -2;
                  }
                  ppbVar5[(long)iVar10 + -1] = (pbVar3->field_2).childs[0];
                  (this->m_rayTestStack).m_data[iVar10] = (pbVar3->field_2).childs[1];
                  iVar11 = iVar10 + 1;
                }
              }
            }
          }
        }
      }
      iVar10 = iVar11;
    } while (iVar10 != 0);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::rayTestInternal(	const btDbvtNode* root,
								const btVector3& rayFrom,
								const btVector3& rayTo,
								const btVector3& rayDirectionInverse,
								unsigned int signs[3],
								btScalar lambda_max,
								const btVector3& aabbMin,
								const btVector3& aabbMax,
								DBVT_IPOLICY) const
{
        (void) rayTo;
	DBVT_CHECKTYPE
	if(root)
	{
		btVector3 resultNormal;

		int								depth=1;
		int								treshold=DOUBLE_STACKSIZE-2;
		btAlignedObjectArray<const btDbvtNode*>&	stack = m_rayTestStack;
		stack.resize(DOUBLE_STACKSIZE);
		stack[0]=root;
		btVector3 bounds[2];
		do	
		{
			const btDbvtNode*	node=stack[--depth];
			bounds[0] = node->volume.Mins()-aabbMax;
			bounds[1] = node->volume.Maxs()-aabbMin;
			btScalar tmin=1.f,lambda_min=0.f;
			unsigned int result1=false;
			result1 = btRayAabb2(rayFrom,rayDirectionInverse,signs,bounds,tmin,lambda_min,lambda_max);
			if(result1)
			{
				if(node->isinternal())
				{
					if(depth>treshold)
					{
						stack.resize(stack.size()*2);
						treshold=stack.size()-2;
					}
					stack[depth++]=node->childs[0];
					stack[depth++]=node->childs[1];
				}
				else
				{
					policy.Process(node);
				}
			}
		} while(depth);
	}
}